

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void * mpack_expect_array_alloc_impl
                 (mpack_reader_t *reader,size_t element_size,uint32_t max_count,uint32_t *out_count,
                 _Bool allow_nil)

{
  mpack_error_t mVar1;
  void *p;
  uint32_t local_38;
  _Bool has_array;
  uint32_t count;
  _Bool allow_nil_local;
  uint32_t *out_count_local;
  size_t sStack_20;
  uint32_t max_count_local;
  size_t element_size_local;
  mpack_reader_t *reader_local;
  
  *out_count = 0;
  p._7_1_ = true;
  has_array = allow_nil;
  _count = out_count;
  out_count_local._4_4_ = max_count;
  sStack_20 = element_size;
  element_size_local = (size_t)reader;
  if (allow_nil) {
    p._7_1_ = mpack_expect_array_max_or_nil(reader,max_count,&local_38);
  }
  else {
    local_38 = mpack_expect_array_max(reader,max_count);
  }
  mVar1 = mpack_reader_error((mpack_reader_t *)element_size_local);
  if (mVar1 == mpack_ok) {
    if (local_38 == 0) {
      if (((has_array & 1U) != 0) && (p._7_1_ != false)) {
        mpack_done_array((mpack_reader_t *)element_size_local);
      }
      reader_local = (mpack_reader_t *)0x0;
    }
    else {
      reader_local = (mpack_reader_t *)malloc(sStack_20 * local_38);
      if (reader_local == (mpack_reader_t *)0x0) {
        mpack_reader_flag_error((mpack_reader_t *)element_size_local,mpack_error_memory);
        reader_local = (mpack_reader_t *)0x0;
      }
      else {
        *_count = local_38;
      }
    }
  }
  else {
    reader_local = (mpack_reader_t *)0x0;
  }
  return reader_local;
}

Assistant:

void* mpack_expect_array_alloc_impl(mpack_reader_t* reader, size_t element_size, uint32_t max_count, uint32_t* out_count, bool allow_nil) {
    mpack_assert(out_count != NULL, "out_count cannot be NULL");
    *out_count = 0;

    uint32_t count;
    bool has_array = true;
    if (allow_nil)
        has_array = mpack_expect_array_max_or_nil(reader, max_count, &count);
    else
        count = mpack_expect_array_max(reader, max_count);
    if (mpack_reader_error(reader))
        return NULL;

    // size 0 is not an error; we return NULL for no elements.
    if (count == 0) {
        // we call mpack_done_array() automatically ONLY if we are using
        // the _or_nil variant. this is the only way to allow nil and empty
        // to work the same way.
        if (allow_nil && has_array)
            mpack_done_array(reader);
        return NULL;
    }

    void* p = MPACK_MALLOC(element_size * count);
    if (p == NULL) {
        mpack_reader_flag_error(reader, mpack_error_memory);
        return NULL;
    }

    *out_count = count;
    return p;
}